

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::gatherv<char>(char *data,size_t size,char *out,
                       vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,
                       comm *comm)

{
  pointer puVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> counts;
  datatype dt_1;
  size_t total_size;
  vector<int,_std::allocator<int>_> displs;
  datatype mpi_sizet;
  
  iVar2 = 0;
  for (puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    iVar2 = iVar2 + (int)*puVar1;
  }
  total_size = (size_t)iVar2;
  mpi_sizet._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  mpi_sizet.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mpi_sizet.builtin = true;
  MPI_Bcast(&total_size,1,&ompi_mpi_unsigned_long,root,comm->mpi_comm);
  if (total_size < 0x7fffffff) {
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
    dt_1.mpitype = (MPI_Datatype)&ompi_mpi_char;
    dt_1.builtin = true;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&counts,(long)comm->m_size,(allocator_type *)&displs);
      std::
      __copy_move_a<false,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      impl::get_displacements<int>(&displs,&counts);
      MPI_Gatherv(data,size & 0xffffffff,dt_1.mpitype,out,
                  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,dt_1.mpitype,root,comm->mpi_comm);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&displs.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&counts.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      MPI_Gatherv(data,size & 0xffffffff,&ompi_mpi_char,0,0,0,&ompi_mpi_char,root,comm->mpi_comm);
    }
    datatype::~datatype(&dt_1);
  }
  else {
    impl::gatherv_big<char>(data,size,out,recv_sizes,root,comm);
  }
  datatype::~datatype(&mpi_sizet);
  return;
}

Assistant:

void gatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    // tell everybody about the total size
    MPI_Bcast(&total_size, 1, mpi_sizet.type(), root, comm);
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::gatherv_big(data, size, out, recv_sizes, root, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        if (comm.rank() == root) {
            std::vector<int> counts(comm.size());
            std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
            std::vector<int> displs = impl::get_displacements(counts);
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        out, &counts[0], &displs[0], dt.type(), root, comm);
        } else {
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        NULL, NULL, NULL, dt.type(), root, comm);
        }
    }
}